

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

void __thiscall ELFIO::elfio::clean(elfio *this)

{
  bool bVar1;
  reference ppsVar2;
  reference ppsVar3;
  __normal_iterator<ELFIO::segment_**,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
  local_50;
  __normal_iterator<ELFIO::segment_**,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
  local_48;
  segment **local_40;
  __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
  local_38;
  const_iterator it1;
  __normal_iterator<ELFIO::section_**,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
  local_28;
  section **local_20;
  __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
  local_18;
  const_iterator it;
  elfio *this_local;
  
  it._M_current = (section **)this;
  if ((this->header != (elf_header *)0x0) && (this->header != (elf_header *)0x0)) {
    (*this->header->_vptr_elf_header[1])();
  }
  this->header = (elf_header *)0x0;
  __gnu_cxx::
  __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
  ::__normal_iterator(&local_18);
  local_28._M_current =
       (section **)
       std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::begin(&this->sections_);
  __gnu_cxx::
  __normal_iterator<ELFIO::section*const*,std::vector<ELFIO::section*,std::allocator<ELFIO::section*>>>
  ::__normal_iterator<ELFIO::section**>
            ((__normal_iterator<ELFIO::section*const*,std::vector<ELFIO::section*,std::allocator<ELFIO::section*>>>
              *)&local_20,&local_28);
  local_18._M_current = local_20;
  while( true ) {
    it1._M_current =
         (segment **)
         std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::end(&this->sections_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<ELFIO::section_**,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
                        *)&it1);
    if (!bVar1) break;
    ppsVar2 = __gnu_cxx::
              __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
              ::operator*(&local_18);
    if (*ppsVar2 != (section *)0x0) {
      (*(*ppsVar2)->_vptr_section[1])();
    }
    __gnu_cxx::
    __normal_iterator<ELFIO::section_*const_*,_std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>::clear(&this->sections_);
  __gnu_cxx::
  __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
  ::__normal_iterator(&local_38);
  local_48._M_current =
       (segment **)
       std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::begin(&this->segments_);
  __gnu_cxx::
  __normal_iterator<ELFIO::segment*const*,std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>>
  ::__normal_iterator<ELFIO::segment**>
            ((__normal_iterator<ELFIO::segment*const*,std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>>
              *)&local_40,&local_48);
  local_38._M_current = local_40;
  while( true ) {
    local_50._M_current =
         (segment **)
         std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::end(&this->segments_);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_50);
    if (!bVar1) break;
    ppsVar3 = __gnu_cxx::
              __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
              ::operator*(&local_38);
    if (*ppsVar3 != (segment *)0x0) {
      (*(*ppsVar3)->_vptr_segment[1])();
    }
    __gnu_cxx::
    __normal_iterator<ELFIO::segment_*const_*,_std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>_>
    ::operator++(&local_38);
  }
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::clear(&this->segments_);
  return;
}

Assistant:

void clean()
    {
		if(header)
			delete header;

        header = 0;

        std::vector<section*>::const_iterator it;
        for ( it = sections_.begin(); it != sections_.end(); ++it ) {
            delete *it;
        }
        sections_.clear();

        std::vector<segment*>::const_iterator it1;
        for ( it1 = segments_.begin(); it1 != segments_.end(); ++it1 ) {
            delete *it1;
        }
        segments_.clear();
    }